

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_lazy_message_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableLazyMessageFieldLiteGenerator::
GenerateBuilderMembers(RepeatedImmutableLazyMessageFieldLiteGenerator *this,Printer *printer)

{
  Printer *printer_local;
  RepeatedImmutableLazyMessageFieldLiteGenerator *this_local;
  
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldLiteGenerator).descriptor_)
  ;
  io::Printer::Print(printer,&(this->super_RepeatedImmutableMessageFieldLiteGenerator).variables_,
                     "$deprecation$public java.util.List<$type$> get$capitalized_name$List() {\n  return java.util.Collections.unmodifiableList(\n      instance.get$capitalized_name$List());\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldLiteGenerator).descriptor_)
  ;
  io::Printer::Print(printer,&(this->super_RepeatedImmutableMessageFieldLiteGenerator).variables_,
                     "$deprecation$public int get$capitalized_name$Count() {\n  return instance.get$capitalized_name$Count();\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldLiteGenerator).descriptor_)
  ;
  io::Printer::Print(printer,&(this->super_RepeatedImmutableMessageFieldLiteGenerator).variables_,
                     "$deprecation$public $type$ get$capitalized_name$(int index) {\n  return instance.get$capitalized_name$(index);\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldLiteGenerator).descriptor_)
  ;
  io::Printer::Print(printer,&(this->super_RepeatedImmutableMessageFieldLiteGenerator).variables_,
                     "$deprecation$public Builder set$capitalized_name$(\n    int index, $type$ value) {\n  copyOnWrite();\n  instance.set$capitalized_name$(index, value);\n  return this;\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldLiteGenerator).descriptor_)
  ;
  io::Printer::Print(printer,&(this->super_RepeatedImmutableMessageFieldLiteGenerator).variables_,
                     "$deprecation$public Builder set$capitalized_name$(\n    int index, $type$.Builder builderForValue) {\n  copyOnWrite();\n  instance.set$capitalized_name$(index, builderForValue);\n  return this;\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldLiteGenerator).descriptor_)
  ;
  io::Printer::Print(printer,&(this->super_RepeatedImmutableMessageFieldLiteGenerator).variables_,
                     "$deprecation$public Builder add$capitalized_name$($type$ value) {\n  copyOnWrite();\n  instance.add$capitalized_name$(value);\n  return this;\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldLiteGenerator).descriptor_)
  ;
  io::Printer::Print(printer,&(this->super_RepeatedImmutableMessageFieldLiteGenerator).variables_,
                     "$deprecation$public Builder add$capitalized_name$(\n    int index, $type$ value) {\n  copyOnWrite();\n  instance.add$capitalized_name$(index, value);\n  return this;\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldLiteGenerator).descriptor_)
  ;
  io::Printer::Print(printer,&(this->super_RepeatedImmutableMessageFieldLiteGenerator).variables_,
                     "$deprecation$public Builder add$capitalized_name$(\n    $type$.Builder builderForValue) {\n  copyOnWrite();\n  instance.add$capitalized_name$(builderForValue);\n  return this;\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldLiteGenerator).descriptor_)
  ;
  io::Printer::Print(printer,&(this->super_RepeatedImmutableMessageFieldLiteGenerator).variables_,
                     "$deprecation$public Builder add$capitalized_name$(\n    int index, $type$.Builder builderForValue) {\n  copyOnWrite();\n  instance.add$capitalized_name$(index, builderForValue);\n  return this;\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldLiteGenerator).descriptor_)
  ;
  io::Printer::Print(printer,&(this->super_RepeatedImmutableMessageFieldLiteGenerator).variables_,
                     "$deprecation$public Builder addAll$capitalized_name$(\n    java.lang.Iterable<? extends $type$> values) {\n  copyOnWrite();\n  instance.addAll$capitalized_name$(values);\n  return this;\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldLiteGenerator).descriptor_)
  ;
  io::Printer::Print(printer,&(this->super_RepeatedImmutableMessageFieldLiteGenerator).variables_,
                     "$deprecation$public Builder clear$capitalized_name$() {\n  copyOnWrite();\n  instance.clear$capitalized_name$();\n  return this;\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldLiteGenerator).descriptor_)
  ;
  io::Printer::Print(printer,&(this->super_RepeatedImmutableMessageFieldLiteGenerator).variables_,
                     "$deprecation$public Builder remove$capitalized_name$(int index) {\n  copyOnWrite();\n  instance.remove$capitalized_name$(index);\n  return this;\n}\n"
                    );
  return;
}

Assistant:

void RepeatedImmutableLazyMessageFieldLiteGenerator::
GenerateBuilderMembers(io::Printer* printer) const {
  // List<Field> getRepeatedFieldList()
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public java.util.List<$type$> get$capitalized_name$List() {\n"
    "  return java.util.Collections.unmodifiableList(\n"
    "      instance.get$capitalized_name$List());\n"
    "}\n");

  // int getRepeatedFieldCount()
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public int get$capitalized_name$Count() {\n"
    "  return instance.get$capitalized_name$Count();\n"
    "}\n");

  // Field getRepeatedField(int index)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public $type$ get$capitalized_name$(int index) {\n"
    "  return instance.get$capitalized_name$(index);\n"
    "}\n");

  // Builder setRepeatedField(int index, Field value)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public Builder set$capitalized_name$(\n"
    "    int index, $type$ value) {\n"
    "  copyOnWrite();\n"
    "  instance.set$capitalized_name$(index, value);\n"
    "  return this;\n"
    "}\n");

  // Builder setRepeatedField(int index, Field.Builder builderForValue)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public Builder set$capitalized_name$(\n"
    "    int index, $type$.Builder builderForValue) {\n"
    "  copyOnWrite();\n"
    "  instance.set$capitalized_name$(index, builderForValue);\n"
    "  return this;\n"
    "}\n");

  // Builder addRepeatedField(Field value)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public Builder add$capitalized_name$($type$ value) {\n"
    "  copyOnWrite();\n"
    "  instance.add$capitalized_name$(value);\n"
    "  return this;\n"
    "}\n");

  // Builder addRepeatedField(int index, Field value)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public Builder add$capitalized_name$(\n"
    "    int index, $type$ value) {\n"
    "  copyOnWrite();\n"
    "  instance.add$capitalized_name$(index, value);\n"
    "  return this;\n"
    "}\n");

  // Builder addRepeatedField(Field.Builder builderForValue)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public Builder add$capitalized_name$(\n"
    "    $type$.Builder builderForValue) {\n"
    "  copyOnWrite();\n"
    "  instance.add$capitalized_name$(builderForValue);\n"
    "  return this;\n"
    "}\n");

  // Builder addRepeatedField(int index, Field.Builder builderForValue)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public Builder add$capitalized_name$(\n"
    "    int index, $type$.Builder builderForValue) {\n"
    "  copyOnWrite();\n"
    "  instance.add$capitalized_name$(index, builderForValue);\n"
    "  return this;\n"
    "}\n");

  // Builder addAllRepeatedField(Iterable<Field> values)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public Builder addAll$capitalized_name$(\n"
    "    java.lang.Iterable<? extends $type$> values) {\n"
    "  copyOnWrite();\n"
    "  instance.addAll$capitalized_name$(values);\n"
    "  return this;\n"
    "}\n");

  // Builder clearAllRepeatedField()
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public Builder clear$capitalized_name$() {\n"
    "  copyOnWrite();\n"
    "  instance.clear$capitalized_name$();\n"
    "  return this;\n"
    "}\n");

  // Builder removeRepeatedField(int index)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public Builder remove$capitalized_name$(int index) {\n"
    "  copyOnWrite();\n"
    "  instance.remove$capitalized_name$(index);\n"
    "  return this;\n"
    "}\n");
}